

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

InternalState anon_unknown.dwarf_15825::parseField(IDataSource *parser,bool isFirstFieldForRow)

{
  uint uVar1;
  int iVar2;
  InternalState local_20;
  InternalState returnState;
  bool isFirstFieldForRow_local;
  IDataSource *parser_local;
  
  (*parser->_vptr_IDataSource[9])();
  if ((isFirstFieldForRow) && (uVar1 = (*parser->_vptr_IDataSource[4])(), (uVar1 & 1) != 0)) {
    do {
      iVar2 = (*parser->_vptr_IDataSource[8])();
      if ((((byte)iVar2 ^ 0xff) & 1) == 0) {
        return EndOfLine;
      }
      uVar1 = (*parser->_vptr_IDataSource[2])();
    } while ((uVar1 & 1) != 0);
    parser_local._4_4_ = EndOfFile;
  }
  else {
    if ((parser->trimLeadingWhitespace & 1U) != 0) {
      skipWhitespace(parser);
    }
    uVar1 = (*parser->_vptr_IDataSource[8])();
    if ((uVar1 & 1) == 0) {
      uVar1 = (*parser->_vptr_IDataSource[7])();
      if ((uVar1 & 1) == 0) {
        local_20 = parseUnescapedString(parser);
      }
      else {
        local_20 = parseEscapedString(parser);
      }
      parser_local._4_4_ = local_20;
    }
    else {
      parser_local._4_4_ = EndOfLine;
    }
  }
  return parser_local._4_4_;
}

Assistant:

InternalState parseField(csv::IDataSource& parser, bool isFirstFieldForRow) {
		//  field = (escaped / non-escaped)

		parser.clear_field();

		// If the first character on the line is a comment character, then
		// skip the line completely.  Only support for single line comments
		if (isFirstFieldForRow && parser.is_comment()) {
			// Skip to end of the line
			while (!parser.is_eol()) {
				if (!parser.next()) {
					return InternalState::EndOfFile;
				}
			}
			return InternalState::EndOfLine;
		}

		if (parser.trimLeadingWhitespace) {
			skipWhitespace(parser);
		}

		if (parser.is_eol()) {
			// Had whitespace before the end of the line, so treat it as
			// a blank field
			return InternalState::EndOfLine;
		}

		InternalState returnState = InternalState::EndOfField;
		if (parser.is_quote()) {
			returnState = parseEscapedString(parser);
		}
		else {
			returnState = parseUnescapedString(parser);
		}

		return returnState;
	}